

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O2

bool S2LatLngRect::IntersectsLatEdge(S2Point *a,S2Point *b,double lat,S1Interval *lng)

{
  double dVar1;
  double dVar2;
  double __x;
  uint uVar3;
  bool bVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar5;
  S1Interval SVar6;
  S2Point local_c8;
  double local_b0;
  undefined1 local_a8 [16];
  D local_98;
  Vector3_d y;
  S1Interval ab_theta;
  
  local_a8._8_8_ = local_a8._0_8_;
  local_a8._0_8_ = lat;
  bVar4 = S2::IsUnitLength(a);
  if (bVar4) {
    bVar4 = S2::IsUnitLength(b);
    if (bVar4) {
      S2::RobustCrossProd(&y,a,b);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                (&local_98,(BasicVector<Vector3,_double,_3UL> *)&y);
      if (local_98.c_[2] < 0.0) {
        local_98.c_[2] = -local_98.c_[2];
        uVar3 = local_98.c_[1]._4_4_;
        local_98.c_[1]._0_4_ = local_98.c_[1]._0_4_;
        local_98.c_[0] = -local_98.c_[0];
        local_98.c_[1]._4_4_ = uVar3 ^ 0x80000000;
      }
      ab_theta.bounds_.c_[0] = 0.0;
      ab_theta.bounds_.c_[1] = 0.0;
      S2::RobustCrossProd((Vector3_d *)&local_c8,&local_98,(S2Point *)&ab_theta);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                (&y,(BasicVector<Vector3,_double,_3UL> *)&local_c8);
      local_c8.c_[0] = local_98.c_[2] * y.c_[1] - y.c_[2] * local_98.c_[1];
      local_c8.c_[1] = local_98.c_[0] * y.c_[2] - y.c_[0] * local_98.c_[2];
      local_c8.c_[2] = local_98.c_[1] * y.c_[0] - y.c_[1] * local_98.c_[0];
      bVar4 = S2::IsUnitLength(&local_c8);
      if (bVar4) {
        if (0.0 <= local_c8.c_[2]) {
          dVar5 = sin((double)local_a8._0_8_);
          if (ABS(dVar5) < local_c8.c_[2]) {
            if (local_c8.c_[2] <= 0.0) {
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)&ab_theta,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
                         ,0x19a,kFatal,(ostream *)&std::cerr);
              std::operator<<((ostream *)ab_theta.bounds_.c_[1],"Check failed: (x[2]) > (0) ");
              goto LAB_002367f8;
            }
            dVar5 = dVar5 / local_c8.c_[2];
            local_b0 = 1.0 - dVar5 * dVar5;
            if (local_b0 < 0.0) {
              local_b0 = sqrt(local_b0);
            }
            else {
              local_b0 = SQRT(local_b0);
            }
            dVar1 = atan2(local_b0,dVar5);
            local_a8._8_4_ = extraout_XMM0_Dc;
            local_a8._0_8_ = dVar1;
            local_a8._12_4_ = extraout_XMM0_Dd;
            dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                              ((BasicVector<Vector3,_double,_3UL> *)a,&y);
            dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                              ((BasicVector<Vector3,_double,_3UL> *)a,&local_c8);
            dVar1 = atan2(dVar1,dVar2);
            dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                              ((BasicVector<Vector3,_double,_3UL> *)b,&y);
            __x = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                            ((BasicVector<Vector3,_double,_3UL> *)b,&local_c8);
            dVar2 = atan2(dVar2,__x);
            SVar6 = S1Interval::FromPointPair(dVar1,dVar2);
            ab_theta.bounds_.c_[0] = SVar6.bounds_.c_[0];
            ab_theta.bounds_.c_[1] = SVar6.bounds_.c_[1];
            bVar4 = S1Interval::Contains(&ab_theta,(double)local_a8._0_8_);
            if (bVar4) {
              dVar1 = atan2(y.c_[1] * local_b0 + local_c8.c_[1] * dVar5,
                            y.c_[0] * local_b0 + local_c8.c_[0] * dVar5);
              bVar4 = S1Interval::Contains(lng,dVar1);
              if (bVar4) {
                return true;
              }
            }
            bVar4 = S1Interval::Contains(&ab_theta,-(double)local_a8._0_8_);
            if (bVar4) {
              dVar5 = atan2(dVar5 * local_c8.c_[1] - local_b0 * y.c_[1],
                            local_c8.c_[0] * dVar5 - y.c_[0] * local_b0);
              bVar4 = S1Interval::Contains(lng,dVar5);
              if (bVar4) {
                return true;
              }
            }
          }
          return false;
        }
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&ab_theta,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
                   ,0x192,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)ab_theta.bounds_.c_[1],"Check failed: (x[2]) >= (0) ");
      }
      else {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&ab_theta,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
                   ,0x191,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)ab_theta.bounds_.c_[1],"Check failed: S2::IsUnitLength(x) ");
      }
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_98,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
                 ,0x187,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)local_98.c_[1],"Check failed: S2::IsUnitLength(b) ");
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x186,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)local_98.c_[1],"Check failed: S2::IsUnitLength(a) ");
  }
LAB_002367f8:
  abort();
}

Assistant:

bool S2LatLngRect::IntersectsLatEdge(const S2Point& a, const S2Point& b,
                                     double lat, const S1Interval& lng) {
  // Return true if the segment AB intersects the given edge of constant
  // latitude.  Unfortunately, lines of constant latitude are curves on
  // the sphere.  They can intersect a straight edge in 0, 1, or 2 points.
  S2_DCHECK(S2::IsUnitLength(a));
  S2_DCHECK(S2::IsUnitLength(b));

  // First, compute the normal to the plane AB that points vaguely north.
  Vector3_d z = S2::RobustCrossProd(a, b).Normalize();
  if (z[2] < 0) z = -z;

  // Extend this to an orthonormal frame (x,y,z) where x is the direction
  // where the great circle through AB achieves its maximium latitude.
  Vector3_d y = S2::RobustCrossProd(z, S2Point(0, 0, 1)).Normalize();
  Vector3_d x = y.CrossProd(z);
  S2_DCHECK(S2::IsUnitLength(x));
  S2_DCHECK_GE(x[2], 0);

  // Compute the angle "theta" from the x-axis (in the x-y plane defined
  // above) where the great circle intersects the given line of latitude.
  double sin_lat = sin(lat);
  if (fabs(sin_lat) >= x[2]) {
    return false;  // The great circle does not reach the given latitude.
  }
  S2_DCHECK_GT(x[2], 0);
  double cos_theta = sin_lat / x[2];
  double sin_theta = sqrt(1 - cos_theta * cos_theta);
  double theta = atan2(sin_theta, cos_theta);

  // The candidate intersection points are located +/- theta in the x-y
  // plane.  For an intersection to be valid, we need to check that the
  // intersection point is contained in the interior of the edge AB and
  // also that it is contained within the given longitude interval "lng".

  // Compute the range of theta values spanned by the edge AB.
  S1Interval ab_theta = S1Interval::FromPointPair(
      atan2(a.DotProd(y), a.DotProd(x)),
      atan2(b.DotProd(y), b.DotProd(x)));

  if (ab_theta.Contains(theta)) {
    // Check if the intersection point is also in the given "lng" interval.
    S2Point isect = x * cos_theta + y * sin_theta;
    if (lng.Contains(atan2(isect[1], isect[0]))) return true;
  }
  if (ab_theta.Contains(-theta)) {
    // Check if the intersection point is also in the given "lng" interval.
    S2Point isect = x * cos_theta - y * sin_theta;
    if (lng.Contains(atan2(isect[1], isect[0]))) return true;
  }
  return false;
}